

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall PowerPos<0,_0,_0>::propagate_case_zero(PowerPos<0,_0,_0> *this)

{
  IntVar *pIVar1;
  int iVar2;
  long lVar3;
  IntVar *pIVar4;
  
  pIVar1 = (this->x).var;
  if (((pIVar1->max).v == 0) && (pIVar4 = (this->z).var, 0 < (pIVar4->max).v)) {
    if (so.lazy) {
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[9])(pIVar1);
      lVar3 = (long)iVar2 * 4 + 2;
      pIVar4 = (this->z).var;
    }
    else {
      lVar3 = 0;
    }
    iVar2 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xf])(pIVar4,0,lVar3,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  pIVar1 = (this->z).var;
  if (((pIVar1->max).v == 0) && (pIVar4 = (this->x).var, 0 < (pIVar4->max).v)) {
    if (so.lazy == true) {
      iVar2 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[9])(pIVar1);
      lVar3 = (long)iVar2 * 4 + 2;
      pIVar4 = (this->x).var;
    }
    else {
      lVar3 = 0;
    }
    iVar2 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xf])(pIVar4,0,lVar3,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate_case_zero() {
		// x -> z
		if (x.getMax() == 0) {
			setDom(z, setMax, 0, x.getMaxLit());
		}
		// z -> x
		if (z.getMax() == 0) {
			setDom(x, setMax, 0, z.getMaxLit());
		}
		return true;
	}